

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int array_container_get_index(array_container_t *arr,uint16_t x)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  array_container_t *paVar5;
  array_container_t *paVar6;
  uint uVar7;
  
  iVar3 = arr->cardinality + -1;
  uVar7 = 0;
  paVar5 = arr;
  do {
    if (iVar3 < (int)uVar7) {
      uVar4 = ~uVar7;
      break;
    }
    uVar4 = uVar7 + iVar3 >> 1;
    paVar6 = (array_container_t *)(ulong)uVar4;
    uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar7 + iVar3 & 0xfffffffe));
    if (uVar1 < x) {
      uVar7 = uVar4 + 1;
      bVar2 = true;
      paVar6 = paVar5;
    }
    else if (x < uVar1) {
      iVar3 = uVar4 - 1;
      bVar2 = true;
      paVar6 = paVar5;
    }
    else {
      bVar2 = false;
    }
    uVar4 = (uint)paVar6;
    paVar5 = paVar6;
  } while (bVar2);
  uVar7 = 0xffffffff;
  if (-1 < (int)uVar4) {
    uVar7 = uVar4;
  }
  return uVar7;
}

Assistant:

inline int array_container_get_index(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        return -1;
    }
}